

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

bool __thiscall
QTreeModel::dropMimeData
          (QTreeModel *this,QMimeData *data,DropAction action,int row,int column,QModelIndex *parent
          )

{
  undefined1 uVar1;
  long *plVar2;
  QAbstractItemModel *pQVar3;
  QAbstractItemModel *pQVar4;
  
  if ((column & row) == 0xffffffff) {
    row = (**(code **)(*(long *)this + 0x78))(this,parent);
  }
  plVar2 = (long *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
  pQVar3 = (parent->m).ptr;
  if (pQVar3 != (QAbstractItemModel *)0x0) {
    pQVar3 = (QAbstractItemModel *)parent->i;
  }
  pQVar4 = (QAbstractItemModel *)0x0;
  if (-1 < (parent->c | parent->r)) {
    pQVar4 = pQVar3;
  }
  uVar1 = (**(code **)(*plVar2 + 800))(plVar2,pQVar4,row,data,action,*(code **)(*plVar2 + 800));
  return (bool)uVar1;
}

Assistant:

bool QTreeModel::dropMimeData(const QMimeData *data, Qt::DropAction action,
                              int row, int column, const QModelIndex &parent)
{
    if (row == -1 && column == -1)
        row = rowCount(parent); // append
    return view()->dropMimeData(item(parent), row, data, action);
}